

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O1

void Gia_CreateHeader(FILE *pFile,int Type,int Size,uchar *pBuffer)

{
  uint __fd;
  ssize_t sVar1;
  uchar *pBuffer_00;
  int Size_00;
  FILE *pFile_00;
  long lVar2;
  uchar *__buf;
  
  fprintf((FILE *)pFile,"%.6d",Type);
  fputc(0x20,(FILE *)pFile);
  fprintf((FILE *)pFile,"%.16d",(ulong)(uint)Size);
  fputc(0x20,(FILE *)pFile);
  fflush((FILE *)pFile);
  __fd = fileno((FILE *)pFile);
  if (0 < Size) {
    lVar2 = 0;
    do {
      __buf = pBuffer + lVar2;
      pFile_00 = (FILE *)(ulong)__fd;
      sVar1 = write(__fd,__buf,Size - lVar2);
      Size_00 = (int)__buf;
      if (sVar1 < 0) {
        Gia_CreateHeader_cold_1();
        Gia_CreateHeader(pFile_00,0xf423c,Size_00,pBuffer_00);
        return;
      }
      lVar2 = lVar2 + sVar1;
    } while (lVar2 < Size);
  }
  return;
}

Assistant:

void Gia_CreateHeader( FILE * pFile, int Type, int Size, unsigned char * pBuffer )
{
    fprintf( pFile, "%.6d", Type );
    fprintf( pFile, " " );
    fprintf( pFile, "%.16d", Size );
    fprintf( pFile, " " );
#if !defined(LIN) && !defined(LIN64)
    {
    int RetValue;
    RetValue = fwrite( pBuffer, Size, 1, pFile );
    assert( RetValue == 1 || Size == 0);
    fflush( pFile );
    }
#else
    fflush(pFile);
    int fd = fileno(pFile);

    ssize_t bytes_written = 0;
    while (bytes_written < Size){
        ssize_t n = write(fd, &pBuffer[bytes_written], Size - bytes_written);
        if (n < 0){
            fprintf(stderr, "BridgeMode: failed to send package; aborting\n"); fflush(stderr);
            _exit(255);
        }
        bytes_written += n;
    }
#endif
}